

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrossPlatformReporters.cpp
# Opt level: O2

void __thiscall
ApprovalTests::CrossPlatform::VisualStudioCodeReporter::VisualStudioCodeReporter
          (VisualStudioCodeReporter *this)

{
  DiffInfo DStack_58;
  
  DiffPrograms::CrossPlatform::VS_CODE();
  GenericDiffReporter::GenericDiffReporter(&this->super_GenericDiffReporter,&DStack_58);
  DiffInfo::~DiffInfo(&DStack_58);
  (this->super_GenericDiffReporter).super_CommandReporter.super_Reporter._vptr_Reporter =
       (_func_int **)&PTR__GenericDiffReporter_0015edf8;
  return;
}

Assistant:

VisualStudioCodeReporter::VisualStudioCodeReporter()
            : GenericDiffReporter(DiffPrograms::CrossPlatform::VS_CODE())
        {
        }